

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall
wabt::Stream::WriteMemoryDump
          (Stream *this,void *start,size_t size,size_t offset,PrintChars print_chars,char *prefix,
          char *desc)

{
  byte bVar1;
  uint32_t value;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  PrintChars local_44;
  long local_40;
  char *local_38;
  
  if ((long)size < 1) {
    return;
  }
  pbVar6 = (byte *)(size + (long)start);
  local_40 = offset - (long)start;
  local_44 = print_chars;
  local_38 = prefix;
LAB_001380b0:
  if (local_38 != (char *)0x0) {
    Writef(this,"%s",local_38);
  }
  bVar2 = false;
  Writef(this,"%07zx: ",(byte *)((long)start + local_40));
  uVar5 = 0;
  do {
    if ((byte *)((long)start + uVar5) < pbVar6) {
      Writef(this,"%02x",(ulong)*(byte *)((long)start + uVar5));
    }
    else {
      local_48 = 0x20;
      WriteData(this,&local_48,1,(char *)0x0,No);
      local_47 = 0x20;
      WriteData(this,&local_47,1,(char *)0x0,No);
    }
    if (bVar2) {
      local_49 = 0x20;
      bVar2 = false;
      WriteData(this,&local_49,1,(char *)0x0,No);
      if (0xe < uVar5) break;
    }
    else {
      bVar2 = true;
    }
    uVar5 = uVar5 + 1;
  } while( true );
  if (local_44 == Yes) {
    local_46 = 0x20;
    WriteData(this,&local_46,1,(char *)0x0,No);
    if (start < pbVar6) {
      uVar4 = 0;
      do {
        bVar1 = *start;
        iVar3 = isprint((uint)bVar1);
        value = (uint)bVar1;
        if (iVar3 == 0) {
          value = 0x2e;
        }
        WriteU8(this,value,(char *)0x0,No);
        start = (void *)((long)start + 1);
      } while ((uVar4 < 0xf) && (uVar4 = uVar4 + 1, start < pbVar6));
    }
  }
  else {
    start = (void *)((long)start + uVar5 + 1);
  }
  if ((desc != (char *)0x0) && (pbVar6 <= start)) {
    Writef(this,"  ; %s",desc);
  }
  local_45 = 10;
  WriteData(this,&local_45,1,(char *)0x0,No);
  if (pbVar6 <= start) {
    return;
  }
  goto LAB_001380b0;
}

Assistant:

void Stream::WriteMemoryDump(const void* start,
                             size_t size,
                             size_t offset,
                             PrintChars print_chars,
                             const char* prefix,
                             const char* desc) {
  const uint8_t* p = static_cast<const uint8_t*>(start);
  const uint8_t* end = p + size;
  while (p < end) {
    const uint8_t* line = p;
    const uint8_t* line_end = p + DUMP_OCTETS_PER_LINE;
    if (prefix) {
      Writef("%s", prefix);
    }
    Writef("%07" PRIzx ": ", reinterpret_cast<intptr_t>(p) -
                                 reinterpret_cast<intptr_t>(start) + offset);
    while (p < line_end) {
      for (int i = 0; i < DUMP_OCTETS_PER_GROUP; ++i, ++p) {
        if (p < end) {
          Writef("%02x", *p);
        } else {
          WriteChar(' ');
          WriteChar(' ');
        }
      }
      WriteChar(' ');
    }

    if (print_chars == PrintChars::Yes) {
      WriteChar(' ');
      p = line;
      for (int i = 0; i < DUMP_OCTETS_PER_LINE && p < end; ++i, ++p)
        WriteChar(isprint(*p) ? *p : '.');
    }

    /* if there are multiple lines, only print the desc on the last one */
    if (p >= end && desc) {
      Writef("  ; %s", desc);
    }
    WriteChar('\n');
  }
}